

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O3

void FsPushOnPaintEvent(void)

{
  XExposeEvent evt;
  
  XSendEvent(ysXDsp,ysXWnd,1,0x8000);
  return;
}

Assistant:

void FsPushOnPaintEvent(void)
{
	XExposeEvent evt;
	evt.type=Expose;
	evt.serial=0;
	evt.send_event=true;
	evt.display=ysXDsp;
	evt.window=ysXWnd;
	evt.x=0;
	evt.y=0;
	evt.width=ysXWid;
	evt.height=ysXHei;
	evt.count=0;
	XSendEvent(ysXDsp,ysXWnd,true,ExposureMask,(XEvent *)&evt);
}